

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ffrecord.c
# Opt level: O0

GCstr * argv2str(jit_State *J,TValue *o)

{
  int iVar1;
  uint uVar2;
  jit_State *in_RSI;
  GCstr *s;
  cTValue *in_stack_ffffffffffffff78;
  GCstr *local_70;
  
  iVar1._0_1_ = (in_RSI->cur).marked;
  iVar1._1_1_ = (in_RSI->cur).gct;
  iVar1._2_2_ = (in_RSI->cur).nsnap;
  if (iVar1 == -5) {
    local_70 = (GCstr *)(ulong)(in_RSI->cur).nextgc.gcptr32;
  }
  else {
    uVar2._0_1_ = (in_RSI->cur).marked;
    uVar2._1_1_ = (in_RSI->cur).gct;
    uVar2._2_2_ = (in_RSI->cur).nsnap;
    if (0xfffeffff < uVar2) {
      lj_trace_err(in_RSI,(TraceError)((ulong)in_stack_ffffffffffffff78 >> 0x20));
    }
    local_70 = lj_strfmt_number((lua_State *)in_RSI,in_stack_ffffffffffffff78);
    (in_RSI->cur).nextgc.gcptr32 = (uint32_t)local_70;
    (in_RSI->cur).marked = 0xfb;
    (in_RSI->cur).gct = 0xff;
    (in_RSI->cur).nsnap = 0xffff;
  }
  return local_70;
}

Assistant:

static GCstr *argv2str(jit_State *J, TValue *o)
{
  if (LJ_LIKELY(tvisstr(o))) {
    return strV(o);
  } else {
    GCstr *s;
    if (!tvisnumber(o))
      lj_trace_err(J, LJ_TRERR_BADTYPE);
    s = lj_strfmt_number(J->L, o);
    setstrV(J->L, o, s);
    return s;
  }
}